

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryExpressionSyntax,slang::syntax::BinaryExpressionSyntax_const&>
          (BumpAllocator *this,BinaryExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  BinaryExpressionSyntax *pBVar8;
  
  pBVar8 = (BinaryExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryExpressionSyntax *)this->endPtr < pBVar8 + 1) {
    pBVar8 = (BinaryExpressionSyntax *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pBVar8 + 1);
  }
  (pBVar8->super_ExpressionSyntax).super_SyntaxNode.previewNode =
       (args->super_ExpressionSyntax).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->super_ExpressionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ExpressionSyntax).super_SyntaxNode.parent;
  (pBVar8->super_ExpressionSyntax).super_SyntaxNode.kind =
       (args->super_ExpressionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar8->super_ExpressionSyntax).super_SyntaxNode.field_0x4 = uVar3;
  (pBVar8->super_ExpressionSyntax).super_SyntaxNode.parent = pSVar1;
  TVar4 = (args->operatorToken).kind;
  uVar5 = (args->operatorToken).field_0x2;
  NVar6.raw = (args->operatorToken).numFlags.raw;
  uVar7 = (args->operatorToken).rawLen;
  (pBVar8->left).ptr = (args->left).ptr;
  (pBVar8->operatorToken).kind = TVar4;
  (pBVar8->operatorToken).field_0x2 = uVar5;
  (pBVar8->operatorToken).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar8->operatorToken).rawLen = uVar7;
  (pBVar8->operatorToken).info = (args->operatorToken).info;
  (pBVar8->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(args->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->attributes).super_SyntaxListBase.super_SyntaxNode.parent;
  (pBVar8->attributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->attributes).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pBVar8->attributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (pBVar8->attributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pBVar8->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pBVar8->attributes).super_SyntaxListBase.childCount =
       (args->attributes).super_SyntaxListBase.childCount;
  sVar2 = (args->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pBVar8->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pBVar8->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar2;
  (pBVar8->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  (pBVar8->right).ptr = (args->right).ptr;
  return pBVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }